

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx512fp16.cpp
# Opt level: O2

void ncnn::cast_fp32_to_fp16_sse_avx512fp16(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 uVar1;
  unsigned_short uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  undefined1 (*pauVar7) [64];
  long lVar8;
  undefined1 (*pauVar9) [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  
  iVar5 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
  uVar6 = 0;
  uVar3 = (ulong)(uint)bottom_blob->c;
  if (bottom_blob->c < 1) {
    uVar3 = uVar6;
  }
  for (; uVar6 != uVar3; uVar6 = uVar6 + 1) {
    pauVar7 = (undefined1 (*) [64])
              (bottom_blob->cstep * uVar6 * bottom_blob->elemsize + (long)bottom_blob->data);
    pauVar9 = (undefined1 (*) [32])
              (top_blob->cstep * uVar6 * top_blob->elemsize + (long)top_blob->data);
    for (iVar4 = 0; iVar4 + 0xf < iVar5; iVar4 = iVar4 + 0x10) {
      auVar11 = vcvtps2phx_avx512fp16(*pauVar7);
      *pauVar9 = auVar11;
      pauVar7 = pauVar7 + 1;
      pauVar9 = pauVar9 + 1;
    }
    for (; iVar4 + 7 < iVar5; iVar4 = iVar4 + 8) {
      auVar10 = vcvtps2phx_avx512fp16(*(undefined1 (*) [32])*pauVar7);
      *(undefined1 (*) [16])*pauVar9 = auVar10;
      pauVar7 = (undefined1 (*) [64])(*pauVar7 + 0x20);
      pauVar9 = (undefined1 (*) [32])((long)*pauVar9 + 0x10);
    }
    for (; iVar4 + 3 < iVar5; iVar4 = iVar4 + 4) {
      auVar10 = vcvtps2phx_avx512fp16(*(undefined1 (*) [16])*pauVar7);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = auVar10._0_8_;
      uVar1 = vmovlps_avx(auVar12);
      *(undefined8 *)*pauVar9 = uVar1;
      pauVar7 = (undefined1 (*) [64])(*pauVar7 + 0x10);
      pauVar9 = (undefined1 (*) [32])((long)*pauVar9 + 8);
    }
    lVar8 = 0;
    for (; iVar4 < iVar5; iVar4 = iVar4 + 1) {
      uVar2 = float32_to_float16(*(float *)(*pauVar7 + lVar8 * 2));
      *(unsigned_short *)((long)*pauVar9 + lVar8) = uVar2;
      lVar8 = lVar8 + 2;
    }
  }
  return;
}

Assistant:

void cast_fp32_to_fp16_sse_avx512fp16(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
}